

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_False_Test::iu_SyntaxTest_x_iutest_x_False_Test
          (iu_SyntaxTest_x_iutest_x_False_Test *this)

{
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00394630;
  return;
}

Assistant:

IUTEST(SyntaxTest, False)
{
    if( bool b = false )
        IUTEST_ASSERT_FALSE(b) << b;
    if( bool b = false )
        IUTEST_EXPECT_FALSE(b) << b;
    if( bool b = false )
        IUTEST_INFORM_FALSE(b) << b;
    if( bool b = false )
        IUTEST_ASSUME_FALSE(b) << b;
}